

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O3

int amqp_ssl_socket_set_key(amqp_socket_t *base,char *cert,char *key)

{
  int iVar1;
  int iVar2;
  
  if (base->klass == &amqp_ssl_socket_class) {
    iVar1 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)base[1].klass,cert);
    iVar2 = -0x200;
    if (iVar1 == 1) {
      iVar1 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)base[1].klass,key,1);
      iVar2 = (uint)(iVar1 == 1) * 0x200 + -0x200;
    }
    return iVar2;
  }
  amqp_abort("<%p> is not of type amqp_ssl_socket_t",base);
}

Assistant:

int amqp_ssl_socket_set_key(amqp_socket_t *base, const char *cert,
                            const char *key) {
  int status;
  struct amqp_ssl_socket_t *self;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_use_certificate_chain_file(self->ctx, cert);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  status = SSL_CTX_use_PrivateKey_file(self->ctx, key, SSL_FILETYPE_PEM);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  return AMQP_STATUS_OK;
}